

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformsurface.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QPlatformSurface *surface)

{
  SurfaceClass SVar1;
  QSurface *this;
  QDebug *pQVar2;
  QPlatformSurface *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  SurfaceClass surfaceClass;
  QSurface *s;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6f;
  SurfaceClass *in_stack_ffffffffffffff70;
  SurfaceClass value;
  undefined4 in_stack_ffffffffffffff98;
  Stream *t;
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  QDebug in_stack_ffffffffffffffd8;
  QDebug in_stack_ffffffffffffffe0;
  QDebug local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  t = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  QDebug::nospace(in_RSI);
  value = (SurfaceClass)((ulong)in_RSI >> 0x20);
  QDebug::operator<<((QDebug *)in_RDI,(char *)t);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,
                     (void *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  if (in_RDX != (QPlatformSurface *)0x0) {
    this = QPlatformSurface::surface(in_RDX);
    SVar1 = QSurface::surfaceClass(this);
    pQVar2 = QDebug::operator<<((QDebug *)in_RDI,(char *)t);
    QDebug::QDebug((QDebug *)&stack0xffffffffffffffe0,pQVar2);
    operator<<((QDebug *)CONCAT44(SVar1,in_stack_ffffffffffffff98),value);
    QDebug::~QDebug(&local_18);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffe0);
    pQVar2 = QDebug::operator<<((QDebug *)in_RDI,(char *)t);
    QDebug::QDebug(&local_30,pQVar2);
    (*this->_vptr_QSurface[4])();
    operator<<((QDebug *)CONCAT44(SVar1,in_stack_ffffffffffffff98),value);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
    QDebug::~QDebug(&local_30);
    if (SVar1 == Window) {
      pQVar2 = QDebug::operator<<((QDebug *)in_RDI,(char *)t);
      QDebug::QDebug(&local_40,pQVar2);
      if (this == (QSurface *)0x0) {
        in_stack_ffffffffffffff70 = (SurfaceClass *)0x0;
      }
      else {
        in_stack_ffffffffffffff70 = &this[-1].m_type;
      }
      operator<<((QDebug *)in_stack_ffffffffffffffe0.stream,
                 (QWindow *)in_stack_ffffffffffffffd8.stream);
      QDebug::~QDebug(&local_38);
      QDebug::~QDebug(&local_40);
    }
    else {
      QDebug::operator<<((QDebug *)in_RDI,(char *)t);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,
                         (void *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    }
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  QDebug::QDebug((QDebug *)in_stack_ffffffffffffff70,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug debug, const QPlatformSurface *surface)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QPlatformSurface(" << (const void *)surface;
    if (surface) {
        QSurface *s = surface->surface();
        auto surfaceClass = s->surfaceClass();
        debug << ", class=" << surfaceClass;
        debug << ", type=" << s->surfaceType();
        if (surfaceClass == QSurface::Window)
            debug << ", window=" << static_cast<QWindow *>(s);
        else
            debug << ", surface=" << s;
    }
    debug << ')';
    return debug;
}